

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS
ref_cavity_form_insert2
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node,REF_INT site,REF_INT protect,
          REF_INT faceid)

{
  bool bVar1;
  uint uVar2;
  bool bVar3;
  REF_INT local_a0;
  bool local_9c;
  bool local_9b;
  bool local_9a;
  REF_INT local_98;
  int local_94;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_BOOL protected_cell;
  REF_INT cell_node;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT seg_nodes [3];
  REF_BOOL has_node;
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_INT cell;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT faceid_local;
  REF_INT protect_local;
  REF_INT site_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  REF_CAVITY ref_cavity_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_node._0_4_ = faceid;
  ref_node._4_4_ = protect;
  faceid_local = site;
  protect_local = node;
  _site_local = ref_grid;
  ref_grid_local = (REF_GRID)ref_cavity;
  uVar2 = ref_cavity_form_empty(ref_cavity,ref_grid,node);
  if (uVar2 == 0) {
    if ((*(int *)(*(long *)&ref_cell[1].size_per + 4) ==
         *(int *)(*(long *)&ref_cell->n + (long)protect_local * 4)) &&
       (*(int *)(*(long *)&ref_cell[1].size_per + 4) ==
        *(int *)(*(long *)&ref_cell->n + (long)faceid_local * 4))) {
      if ((_site_local->cell[9]->n < 1) && (_site_local->cell[10]->n < 1)) {
        _cell = _site_local->cell[3];
        if ((faceid_local < 0) || (_cell->ref_adj->nnode <= faceid_local)) {
          local_94 = -1;
        }
        else {
          local_94 = _cell->ref_adj->first[faceid_local];
        }
        already_have_it = local_94;
        if (local_94 == -1) {
          local_98 = -1;
        }
        else {
          local_98 = _cell->ref_adj->item[local_94].ref;
        }
        all_local = local_98;
        while (already_have_it != -1) {
          bVar3 = false;
          for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < _cell->node_per;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            bVar1 = !bVar3;
            bVar3 = true;
            if (bVar1) {
              bVar3 = ref_node._4_4_ ==
                      _cell->c2n[ref_private_macro_code_rss_1 + _cell->size_per * all_local];
            }
          }
          if ((!bVar3) &&
             (((REF_INT)ref_node == -1 ||
              ((REF_INT)ref_node == _cell->c2n[_cell->node_per + _cell->size_per * all_local])))) {
            uVar2 = ref_list_contains((REF_LIST)ref_grid_local->cell[7],all_local,&has_node);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x45e,"ref_cavity_form_insert2",(ulong)uVar2,"have tri?");
              return uVar2;
            }
            if (has_node != 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x45f,"ref_cavity_form_insert2","added tri twice?");
              return 1;
            }
            uVar2 = ref_list_push((REF_LIST)ref_grid_local->cell[7],all_local);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x460,"ref_cavity_form_insert2",(ulong)uVar2,"save tri");
              return uVar2;
            }
            uVar2 = ref_cell_all_local(_cell,(REF_NODE)ref_cell,all_local,seg_nodes + 2);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x461,"ref_cavity_form_insert2",(ulong)uVar2,"local cell");
              return uVar2;
            }
            if (seg_nodes[2] == 0) {
              *(undefined4 *)&ref_grid_local->mpi = 3;
              return 0;
            }
            seg_nodes[0] = _cell->c2n[_cell->node_per + _cell->size_per * all_local];
            cell_node = _cell->c2n[_cell->size_per * all_local + 1];
            ref_private_macro_code_rss = _cell->c2n[_cell->size_per * all_local + 2];
            local_9a = protect_local == cell_node || protect_local == ref_private_macro_code_rss;
            seg_nodes[1] = (REF_INT)local_9a;
            if ((seg_nodes[1] == 0) &&
               (uVar2 = ref_cavity_insert_seg((REF_CAVITY)ref_grid_local,&cell_node), uVar2 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x46c,"ref_cavity_form_insert2",(ulong)uVar2,"tri side");
              return uVar2;
            }
            cell_node = _cell->c2n[_cell->size_per * all_local + 2];
            ref_private_macro_code_rss = _cell->c2n[_cell->size_per * all_local];
            local_9b = protect_local == cell_node || protect_local == ref_private_macro_code_rss;
            seg_nodes[1] = (REF_INT)local_9b;
            if ((seg_nodes[1] == 0) &&
               (uVar2 = ref_cavity_insert_seg((REF_CAVITY)ref_grid_local,&cell_node), uVar2 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x472,"ref_cavity_form_insert2",(ulong)uVar2,"tri side");
              return uVar2;
            }
            cell_node = _cell->c2n[_cell->size_per * all_local];
            ref_private_macro_code_rss = _cell->c2n[_cell->size_per * all_local + 1];
            local_9c = protect_local == cell_node || protect_local == ref_private_macro_code_rss;
            seg_nodes[1] = (REF_INT)local_9c;
            if ((seg_nodes[1] == 0) &&
               (uVar2 = ref_cavity_insert_seg((REF_CAVITY)ref_grid_local,&cell_node), uVar2 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x478,"ref_cavity_form_insert2",(ulong)uVar2,"tri side");
              return uVar2;
            }
          }
          already_have_it = _cell->ref_adj->item[already_have_it].next;
          if (already_have_it == -1) {
            local_a0 = -1;
          }
          else {
            local_a0 = _cell->ref_adj->item[already_have_it].ref;
          }
          all_local = local_a0;
        }
        if (*(int *)((long)ref_grid_local->cell + 100) != 0) {
          ref_cavity_tec((REF_CAVITY)ref_grid_local,"form-tri.tec");
        }
        if (*(int *)((long)ref_grid_local->cell + 100) != 0) {
          printf("insert form tri state %d\n",(ulong)*(uint *)&ref_grid_local->mpi);
        }
        uVar2 = ref_cavity_verify_seg_manifold((REF_CAVITY)ref_grid_local);
        if (uVar2 == 0) {
          if (*(int *)((long)ref_grid_local->cell + 100) != 0) {
            printf("insert tri manifold state %d\n",(ulong)*(uint *)&ref_grid_local->mpi);
          }
          uVar2 = ref_cavity_enlarge_conforming((REF_CAVITY)ref_grid_local);
          if (uVar2 == 0) {
            if (*(int *)&ref_grid_local->mpi == 1) {
              *(undefined4 *)&ref_grid_local->mpi = 0;
              if (*(int *)((long)ref_grid_local->cell + 100) != 0) {
                printf("insert tri conforming state %d\n",(ulong)*(uint *)&ref_grid_local->mpi);
              }
              ref_cavity_local._4_4_ =
                   ref_cavity_form_insert2_tet((REF_CAVITY)ref_grid_local,(REF_INT)ref_node);
              if (ref_cavity_local._4_4_ == 0) {
                ref_cavity_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x48c,"ref_cavity_form_insert2",(ulong)ref_cavity_local._4_4_,
                       "form tet ball");
              }
            }
            else {
              ref_cavity_local._4_4_ = 1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x484,"ref_cavity_form_insert2",(ulong)uVar2,"enlarge boundary");
            ref_cavity_local._4_4_ = uVar2;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x480,"ref_cavity_form_insert2",(ulong)uVar2,"ball seg manifold");
          ref_cavity_local._4_4_ = uVar2;
        }
      }
      else {
        *(undefined4 *)&ref_grid_local->mpi = 4;
        ref_cavity_local._4_4_ = 0;
      }
    }
    else {
      *(undefined4 *)&ref_grid_local->mpi = 3;
      ref_cavity_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x442,
           "ref_cavity_form_insert2",(ulong)uVar2,"init form empty");
    ref_cavity_local._4_4_ = uVar2;
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert2(REF_CAVITY ref_cavity,
                                           REF_GRID ref_grid, REF_INT node,
                                           REF_INT site, REF_INT protect,
                                           REF_INT faceid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell;
  REF_BOOL already_have_it, all_local, has_node;
  REF_INT seg_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node) || !ref_node_owned(ref_node, site)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    /* only insert tri with faceid if not empty */
    if (REF_EMPTY != faceid &&
        faceid != ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell))
      continue;
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tri?");
    RAS(!already_have_it, "added tri twice?");
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }

    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
  }

  if (ref_cavity_debug(ref_cavity)) ref_cavity_tec(ref_cavity, "form-tri.tec");

  if (ref_cavity_debug(ref_cavity))
    printf("insert form tri state %d\n", (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert tri manifold state %d\n", (int)ref_cavity_state(ref_cavity));

  RSS(ref_cavity_enlarge_conforming(ref_cavity), "enlarge boundary");
  if (REF_CAVITY_VISIBLE != ref_cavity_state(ref_cavity)) return REF_FAILURE;
  ref_cavity_state(ref_cavity) = REF_CAVITY_UNKNOWN;

  if (ref_cavity_debug(ref_cavity))
    printf("insert tri conforming state %d\n",
           (int)ref_cavity_state(ref_cavity));

  RSS(ref_cavity_form_insert2_tet(ref_cavity, faceid), "form tet ball");

  return REF_SUCCESS;
}